

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall pbrt::TexInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,TexInfo *this)

{
  ColorEncodingHandle *in_stack_fffffffffffffff0;
  
  StringPrintf<std::__cxx11::string_const&,std::__cxx11::string_const&,float_const&,pbrt::WrapMode_const&,pbrt::ColorEncodingHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ TexInfo filename: %s filter: %s maxAniso: %f wrapMode: %s encoding: %s ]",
             (char *)this,&this->filter,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->maxAniso,
             (float *)&this->wrapMode,(WrapMode *)&this->encoding,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string TexInfo::ToString() const {
    return StringPrintf("[ TexInfo filename: %s filter: %s maxAniso: %f "
                        "wrapMode: %s encoding: %s ]",
                        filename, filter, maxAniso, wrapMode, encoding);
}